

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlChar * xmlXPathScanName(xmlXPathParserContextPtr ctxt)

{
  xmlChar *cur_00;
  int iVar1;
  xmlChar *pxVar2;
  bool bVar3;
  uint local_38;
  xmlChar *ret;
  xmlChar *cur;
  int c;
  int l;
  xmlXPathParserContextPtr ctxt_local;
  
  cur_00 = ctxt->cur;
  _c = ctxt;
  cur._0_4_ = xmlXPathCurrentChar(ctxt,(int *)((long)&cur + 4));
  if ((((uint)cur != 0x20) && ((uint)cur != 0x3e)) && ((uint)cur != 0x2f)) {
    if ((int)(uint)cur < 0x100) {
      if ((((((0x40 < (int)(uint)cur) && ((int)(uint)cur < 0x5b)) ||
            ((0x60 < (int)(uint)cur && ((int)(uint)cur < 0x7b)))) ||
           ((0xbf < (int)(uint)cur && ((int)(uint)cur < 0xd7)))) ||
          ((0xd7 < (int)(uint)cur && ((int)(uint)cur < 0xf7)))) || (0xf7 < (int)(uint)cur))
      goto LAB_0022e87b;
    }
    else {
      iVar1 = xmlCharInRange((uint)cur,&xmlIsBaseCharGroup);
      if (iVar1 != 0) goto LAB_0022e87b;
    }
    if (((0xff < (int)(uint)cur) &&
        ((((0x4dff < (int)(uint)cur && ((int)(uint)cur < 0x9fa6)) || ((uint)cur == 0x3007)) ||
         ((0x3020 < (int)(uint)cur && ((int)(uint)cur < 0x302a)))))) ||
       (((uint)cur == 0x5f || ((uint)cur == 0x3a)))) {
LAB_0022e87b:
      do {
        bVar3 = false;
        if ((((uint)cur != 0x20) && (bVar3 = false, (uint)cur != 0x3e)) &&
           (bVar3 = false, (uint)cur != 0x2f)) {
          if ((int)(uint)cur < 0x100) {
            if (((((int)(uint)cur < 0x41) || (bVar3 = true, 0x5a < (int)(uint)cur)) &&
                (((int)(uint)cur < 0x61 || (bVar3 = true, 0x7a < (int)(uint)cur)))) &&
               ((((int)(uint)cur < 0xc0 || (bVar3 = true, 0xd6 < (int)(uint)cur)) &&
                ((((int)(uint)cur < 0xd8 || (bVar3 = true, 0xf6 < (int)(uint)cur)) &&
                 (bVar3 = true, (int)(uint)cur < 0xf8)))))) {
LAB_0022e94f:
              if (((int)(uint)cur < 0x100) ||
                 (((((int)(uint)cur < 0x4e00 || (bVar3 = true, 0x9fa5 < (int)(uint)cur)) &&
                   (bVar3 = true, (uint)cur != 0x3007)) &&
                  (((int)(uint)cur < 0x3021 || (bVar3 = true, 0x3029 < (int)(uint)cur)))))) {
                if ((int)(uint)cur < 0x100) {
                  if (((int)(uint)cur < 0x30) || (bVar3 = true, 0x39 < (int)(uint)cur)) {
LAB_0022e9f7:
                    bVar3 = true;
                    if (((uint)cur != 0x2e) &&
                       (((bVar3 = true, (uint)cur != 0x2d && (bVar3 = true, (uint)cur != 0x5f)) &&
                        (bVar3 = true, (uint)cur != 0x3a)))) {
                      if (0xff < (int)(uint)cur) {
                        iVar1 = xmlCharInRange((uint)cur,&xmlIsCombiningGroup);
                        bVar3 = true;
                        if (iVar1 != 0) goto LAB_0022ea9e;
                      }
                      if ((int)(uint)cur < 0x100) {
                        local_38 = (uint)((uint)cur == 0xb7);
                      }
                      else {
                        local_38 = xmlCharInRange((uint)cur,&xmlIsExtenderGroup);
                      }
                      bVar3 = local_38 != 0;
                    }
                  }
                }
                else {
                  iVar1 = xmlCharInRange((uint)cur,&xmlIsDigitGroup);
                  bVar3 = true;
                  if (iVar1 == 0) goto LAB_0022e9f7;
                }
              }
            }
          }
          else {
            iVar1 = xmlCharInRange((uint)cur,&xmlIsBaseCharGroup);
            bVar3 = true;
            if (iVar1 == 0) goto LAB_0022e94f;
          }
        }
LAB_0022ea9e:
        if (!bVar3) {
          pxVar2 = xmlStrndup(cur_00,(int)_c->cur - (int)cur_00);
          if (pxVar2 == (xmlChar *)0x0) {
            xmlXPathPErrMemory(_c);
          }
          _c->cur = cur_00;
          return pxVar2;
        }
        _c->cur = _c->cur + cur._4_4_;
        cur._0_4_ = xmlXPathCurrentChar(_c,(int *)((long)&cur + 4));
      } while( true );
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

static xmlChar *
xmlXPathScanName(xmlXPathParserContextPtr ctxt) {
    int l;
    int c;
    const xmlChar *cur;
    xmlChar *ret;

    cur = ctxt->cur;

    c = CUR_CHAR(l);
    if ((c == ' ') || (c == '>') || (c == '/') || /* accelerators */
	(!IS_LETTER(c) && (c != '_') &&
         (c != ':'))) {
	return(NULL);
    }

    while ((c != ' ') && (c != '>') && (c != '/') && /* test bigname.xml */
	   ((IS_LETTER(c)) || (IS_DIGIT(c)) ||
            (c == '.') || (c == '-') ||
	    (c == '_') || (c == ':') ||
	    (IS_COMBINING(c)) ||
	    (IS_EXTENDER(c)))) {
	NEXTL(l);
	c = CUR_CHAR(l);
    }
    ret = xmlStrndup(cur, ctxt->cur - cur);
    if (ret == NULL)
        xmlXPathPErrMemory(ctxt);
    ctxt->cur = cur;
    return(ret);
}